

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_makeArrayWithElements
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t result,sysbvm_tuple_t elements)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t value;
  sysbvm_tuple_t instruction;
  size_t i;
  sysbvm_tuple_t operands;
  size_t elementCount;
  sysbvm_tuple_t elements_local;
  sysbvm_tuple_t result_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_array_getSize(elements);
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,sVar1 >> 4);
  sVar2 = sysbvm_array_create(context,sVar1 + 1);
  sysbvm_array_atPut(sVar2,0,result);
  for (instruction = 0; instruction < sVar1; instruction = instruction + 1) {
    value = sysbvm_array_at(elements,instruction);
    sysbvm_array_atPut(sVar2,instruction + 1,value);
  }
  sVar2 = sysbvm_functionBytecodeAssemblerInstruction_create(context,0x80,sVar2);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar2);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_makeArrayWithElements(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t result, sysbvm_tuple_t elements)
{
    size_t elementCount = sysbvm_array_getSize(elements);
    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, elementCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 1 + elementCount);
    sysbvm_array_atPut(operands, 0, result);
    for(size_t i = 0; i < elementCount; ++i)
        sysbvm_array_atPut(operands, 1 + i, sysbvm_array_at(elements, i));
    
    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}